

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O3

bool Assimp::Blender::read<Assimp::Blender::MTexPoly>
               (Structure *s,MTexPoly *p,size_t cnt,FileDatabase *db)

{
  Image **ppIVar1;
  MTexPoly read;
  MTexPoly local_50;
  
  if (cnt != 0) {
    ppIVar1 = &p->tpage;
    do {
      local_50.super_ElemBase.dna_type = (char *)0x0;
      local_50.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_00810ea8;
      Structure::Convert<Assimp::Blender::MTexPoly>(s,&local_50,db);
      ppIVar1[-1] = (Image *)local_50.super_ElemBase.dna_type;
      *ppIVar1 = local_50.tpage;
      ppIVar1[1] = (Image *)local_50._24_8_;
      ppIVar1 = ppIVar1 + 4;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }